

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-s-parser.cpp
# Opt level: O2

HeapType __thiscall
wasm::SExpressionWasmBuilder::getFunctionType(SExpressionWasmBuilder *this,Name name,Element *s)

{
  size_t sVar1;
  iterator iVar2;
  string *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_48 [8];
  Name name_local;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  allocator<char> local_21;
  
  name_local.super_IString.str._M_len = name.super_IString.str._M_str;
  local_48 = name.super_IString.str._M_len;
  iVar2 = std::
          _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::HeapType>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::HeapType>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::HeapType>_>_>
          ::find(&(this->functionTypes)._M_t,(key_type *)local_48);
  if ((_Rb_tree_header *)iVar2._M_node != &(this->functionTypes)._M_t._M_impl.super__Rb_tree_header)
  {
    return (HeapType)(uintptr_t)iVar2._M_node[1]._M_left;
  }
  this_00 = (string *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_68,(basic_string_view<char,_std::char_traits<char>_> *)local_48,
             &local_21);
  std::operator+(&local_88,"invalid call target: ",&local_68);
  name_local.super_IString.str._M_str = (char *)s->line;
  sVar1 = s->col;
  std::__cxx11::string::string(this_00,(string *)&local_88);
  uStack_30 = (undefined4)sVar1;
  uStack_2c = (undefined4)(sVar1 >> 0x20);
  *(undefined4 *)(this_00 + 0x20) = name_local.super_IString.str._M_str._0_4_;
  *(undefined4 *)(this_00 + 0x24) = name_local.super_IString.str._M_str._4_4_;
  *(undefined4 *)(this_00 + 0x28) = uStack_30;
  *(undefined4 *)(this_00 + 0x2c) = uStack_2c;
  __cxa_throw(this_00,&ParseException::typeinfo,ParseException::~ParseException);
}

Assistant:

HeapType SExpressionWasmBuilder::getFunctionType(Name name, Element& s) {
  auto iter = functionTypes.find(name);
  if (iter == functionTypes.end()) {
    throw ParseException(
      "invalid call target: " + std::string(name.str), s.line, s.col);
  }
  return iter->second;
}